

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLcycleFams.c
# Opt level: O0

RDL_cfURF * RDL_findCycleFams(RDL_graph *gra,RDL_sPathInfo *spi)

{
  long lVar1;
  void *pvVar2;
  RDL_cfURF *rc;
  RDL_sPathInfo *spi_local;
  RDL_graph *gra_local;
  
  gra_local = (RDL_graph *)malloc(0x10);
  *(uint *)((long)&gra_local->degree + 4) = 0x40;
  pvVar2 = malloc((ulong)*(uint *)((long)&gra_local->degree + 4) << 3);
  *(void **)gra_local = pvVar2;
  *(uint *)&gra_local->degree = 0;
  RDL_vismara((RDL_cfURF *)gra_local,gra,spi);
  lVar1._0_4_ = gra_local->V;
  lVar1._4_4_ = gra_local->E;
  if (lVar1 == 0) {
    (*RDL_outputFunc)(RDL_ERROR,"Graph is too large, can\'t allocate memory!\n");
    free(gra_local);
    gra_local = (RDL_graph *)0x0;
  }
  else {
    *(uint *)((long)&gra_local->degree + 4) = *(uint *)&gra_local->degree;
    pvVar2 = realloc(*(void **)gra_local,(ulong)*(uint *)((long)&gra_local->degree + 4) << 3);
    *(void **)gra_local = pvVar2;
    qsort(*(void **)gra_local,(ulong)*(uint *)&gra_local->degree,8,RDL_cycleFamsComp);
  }
  return (RDL_cfURF *)gra_local;
}

Assistant:

RDL_cfURF *RDL_findCycleFams(RDL_graph *gra, RDL_sPathInfo *spi)
{
  RDL_cfURF *rc = malloc(sizeof(*rc));
  /*number of CFs is at most 2m^2+vn (Vismara Lemma 3)*/

  rc->alloced = 64;
  rc->fams = malloc(rc->alloced * sizeof(*rc->fams));
  rc->nofFams = 0;
  RDL_vismara(rc, gra, spi);

  if (!rc->fams) {
    RDL_outputFunc(RDL_ERROR, "Graph is too large, can't allocate memory!\n");
    free(rc);
    return NULL;
  }

  rc->alloced = rc->nofFams;
  rc->fams = realloc(rc->fams, rc->alloced * sizeof(*rc->fams));

  /* sort by size */
  qsort(rc->fams, rc->nofFams, sizeof(*rc->fams), RDL_cycleFamsComp);
  return rc;
}